

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O0

Pass * wasm::createInstrumentMemoryPass(void)

{
  InstrumentMemory *this;
  
  this = (InstrumentMemory *)operator_new(0x138);
  memset(this,0,0x138);
  InstrumentMemory::InstrumentMemory(this);
  return (Pass *)this;
}

Assistant:

Pass* createInstrumentMemoryPass() { return new InstrumentMemory(); }